

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O1

void __thiscall QCompleterPrivate::~QCompleterPrivate(QCompleterPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR__QCompleterPrivate_00823648;
  if (this->popup != (QAbstractItemView *)0x0) {
    (**(code **)(*(long *)&(this->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                0x20))();
  }
  pDVar1 = (this->prefix).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->prefix).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->widget).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if ((*(int *)pDVar2 == 0) && (pDVar2 = (this->widget).wp.d, pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

~QCompleterPrivate() { delete popup; }